

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

bool __thiscall cmCacheManager::SaveCache(cmCacheManager *this,string *path)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  ostream *poVar6;
  string *psVar7;
  reference ppVar8;
  CacheEntry *this_00;
  pointer key;
  CacheIterator CVar9;
  undefined1 local_af0 [8];
  ofstream checkCache;
  string checkCacheFile;
  string local_8c8;
  string local_8a8;
  allocator local_881;
  string local_880;
  allocator local_859;
  string local_858;
  char *local_838;
  char *help_1;
  undefined1 auStack_828 [4];
  CacheEntryType t_1;
  CacheIterator i_1;
  string local_810;
  allocator local_7e9;
  string local_7e8;
  allocator local_7c1;
  string local_7c0;
  char *local_7a0;
  char *help;
  string *psStack_790;
  CacheEntryType t;
  CacheEntry *ce;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>
  local_780;
  iterator local_778;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>
  local_770;
  const_iterator i;
  string local_760;
  undefined1 local_740 [8];
  string currentcwd;
  string local_718;
  allocator local_6f1;
  string local_6f0;
  allocator local_6c9;
  string local_6c8;
  char local_6a8 [8];
  char temp [1024];
  undefined1 local_298 [8];
  cmGeneratedFileStream fout;
  string local_40 [8];
  string cacheFile;
  string *path_local;
  cmCacheManager *this_local;
  
  cacheFile.field_2._8_8_ = path;
  std::__cxx11::string::string(local_40,(string *)path);
  std::__cxx11::string::operator+=(local_40,"/CMakeCache.txt");
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_298,pcVar5,false);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_298,true);
  bVar2 = std::ios::operator!((ios *)(local_298 + (long)*(_func_int **)((long)local_298 + -0x18)));
  if ((bVar2 & 1) == 0) {
    uVar4 = cmVersion::GetMinorVersion();
    sprintf(local_6a8,"%d",(ulong)uVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6c8,"CMAKE_CACHE_MINOR_VERSION",&local_6c9);
    AddCacheEntry(this,&local_6c8,local_6a8,
                  "Minor version of cmake used to create the current loaded cache",INTERNAL);
    std::__cxx11::string::~string((string *)&local_6c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
    uVar4 = cmVersion::GetMajorVersion();
    sprintf(local_6a8,"%d",(ulong)uVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6f0,"CMAKE_CACHE_MAJOR_VERSION",&local_6f1);
    AddCacheEntry(this,&local_6f0,local_6a8,
                  "Major version of cmake used to create the current loaded cache",INTERNAL);
    std::__cxx11::string::~string((string *)&local_6f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
    uVar4 = cmVersion::GetPatchVersion();
    sprintf(local_6a8,"%d",(ulong)uVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_718,"CMAKE_CACHE_PATCH_VERSION",
               (allocator *)(currentcwd.field_2._M_local_buf + 0xf));
    AddCacheEntry(this,&local_718,local_6a8,
                  "Patch version of cmake used to create the current loaded cache",INTERNAL);
    std::__cxx11::string::~string((string *)&local_718);
    std::allocator<char>::~allocator((allocator<char> *)(currentcwd.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)local_740,(string *)cacheFile.field_2._8_8_);
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_740);
    if ((('@' < *pcVar5) &&
        (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_740), *pcVar5 < '[')) &&
       (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_740), *pcVar5 == ':')) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_740);
      cVar1 = *pcVar5;
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_740);
      *pcVar5 = cVar1 + ' ';
    }
    cmsys::SystemTools::ConvertToUnixSlashes((string *)local_740);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_760,"CMAKE_CACHEFILE_DIR",(allocator *)((long)&i._M_node + 7));
    pcVar5 = (char *)std::__cxx11::string::c_str();
    AddCacheEntry(this,&local_760,pcVar5,
                  "This is the directory where this CMakeCache.txt was created",INTERNAL);
    std::__cxx11::string::~string((string *)&local_760);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i._M_node + 7));
    poVar6 = std::operator<<((ostream *)local_298,"# This is the CMakeCache file.\n");
    poVar6 = std::operator<<(poVar6,"# For build in directory: ");
    poVar6 = std::operator<<(poVar6,(string *)local_740);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"# It was generated by CMake: ");
    psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    poVar6 = std::operator<<(poVar6,(string *)psVar7);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<((ostream *)local_298,
                             "# You can edit this file to change values found and used by cmake.");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<(poVar6,
                             "# If you do not want to change any of the values, simply exit the editor."
                            );
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<(poVar6,
                             "# If you do want to change a value, simply edit, save, and exit the editor."
                            );
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<(poVar6,"# The syntax for the file is as follows:\n");
    poVar6 = std::operator<<(poVar6,"# KEY:TYPE=VALUE\n");
    poVar6 = std::operator<<(poVar6,"# KEY is the name of a variable in the cache.\n");
    poVar6 = std::operator<<(poVar6,
                             "# TYPE is a hint to GUIs for the type of VALUE, DO NOT EDIT TYPE!.");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::operator<<(poVar6,"# VALUE is the current value for the KEY.\n\n");
    std::operator<<((ostream *)local_298,"########################\n");
    std::operator<<((ostream *)local_298,"# EXTERNAL cache entries\n");
    std::operator<<((ostream *)local_298,"########################\n");
    std::operator<<((ostream *)local_298,"\n");
    local_778._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
         ::begin(&this->Cache);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>
    ::_Rb_tree_const_iterator(&local_770,&local_778);
    while( true ) {
      ce = (CacheEntry *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
           ::end(&this->Cache);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>
      ::_Rb_tree_const_iterator(&local_780,(iterator *)&ce);
      bVar3 = std::operator!=(&local_770,&local_780);
      if (!bVar3) break;
      ppVar8 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>
               ::operator*(&local_770);
      this_00 = &ppVar8->second;
      help._4_4_ = (ppVar8->second).Type;
      psStack_790 = &this_00->Value;
      if ((((ppVar8->second).Initialized & 1U) != 0) && (help._4_4_ != INTERNAL)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_7c0,"HELPSTRING",&local_7c1);
        pcVar5 = CacheEntry::GetProperty(this_00,&local_7c0);
        std::__cxx11::string::~string((string *)&local_7c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
        local_7a0 = pcVar5;
        if (pcVar5 == (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_810,"Missing description",
                     (allocator *)((long)&i_1.Position._M_node + 7));
          OutputHelpString((ostream *)local_298,&local_810);
          std::__cxx11::string::~string((string *)&local_810);
          std::allocator<char>::~allocator((allocator<char> *)((long)&i_1.Position._M_node + 7));
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_7e8,pcVar5,&local_7e9);
          OutputHelpString((ostream *)local_298,&local_7e8);
          std::__cxx11::string::~string((string *)&local_7e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
        }
        key = std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>
              ::operator->(&local_770);
        OutputKey((ostream *)local_298,&key->first);
        poVar6 = std::operator<<((ostream *)local_298,":");
        pcVar5 = cmState::CacheEntryTypeToString(help._4_4_);
        poVar6 = std::operator<<(poVar6,pcVar5);
        std::operator<<(poVar6,"=");
        OutputValue((ostream *)local_298,psStack_790);
        std::operator<<((ostream *)local_298,"\n\n");
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>
      ::operator++(&local_770);
    }
    std::operator<<((ostream *)local_298,"\n");
    std::operator<<((ostream *)local_298,"########################\n");
    std::operator<<((ostream *)local_298,"# INTERNAL cache entries\n");
    std::operator<<((ostream *)local_298,"########################\n");
    std::operator<<((ostream *)local_298,"\n");
    CVar9 = NewIterator(this);
    while( true ) {
      i_1.Container = (cmCacheManager *)CVar9.Position._M_node;
      _auStack_828 = CVar9.Container;
      bVar3 = CacheIterator::IsAtEnd((CacheIterator *)auStack_828);
      if (((bVar3 ^ 0xffU) & 1) == 0) break;
      bVar3 = CacheIterator::Initialized((CacheIterator *)auStack_828);
      if (bVar3) {
        help_1._4_4_ = CacheIterator::GetType((CacheIterator *)auStack_828);
        WritePropertyEntries(this,(ostream *)local_298,(CacheIterator *)auStack_828);
        if (help_1._4_4_ == INTERNAL) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_858,"HELPSTRING",&local_859);
          pcVar5 = CacheIterator::GetProperty((CacheIterator *)auStack_828,&local_858);
          std::__cxx11::string::~string((string *)&local_858);
          std::allocator<char>::~allocator((allocator<char> *)&local_859);
          local_838 = pcVar5;
          if (pcVar5 != (char *)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_880,pcVar5,&local_881);
            OutputHelpString((ostream *)local_298,&local_880);
            std::__cxx11::string::~string((string *)&local_880);
            std::allocator<char>::~allocator((allocator<char> *)&local_881);
          }
          CacheIterator::GetName_abi_cxx11_(&local_8a8,(CacheIterator *)auStack_828);
          OutputKey((ostream *)local_298,&local_8a8);
          std::__cxx11::string::~string((string *)&local_8a8);
          poVar6 = std::operator<<((ostream *)local_298,":");
          pcVar5 = cmState::CacheEntryTypeToString(help_1._4_4_);
          poVar6 = std::operator<<(poVar6,pcVar5);
          std::operator<<(poVar6,"=");
          pcVar5 = CacheIterator::GetValue((CacheIterator *)auStack_828);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_8c8,pcVar5,
                     (allocator *)(checkCacheFile.field_2._M_local_buf + 0xf));
          OutputValue((ostream *)local_298,&local_8c8);
          std::__cxx11::string::~string((string *)&local_8c8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(checkCacheFile.field_2._M_local_buf + 0xf));
          std::operator<<((ostream *)local_298,"\n");
        }
      }
      CacheIterator::Next((CacheIterator *)auStack_828);
      CVar9.Position._M_node = (_Base_ptr)i_1.Container;
      CVar9.Container = _auStack_828;
    }
    std::operator<<((ostream *)local_298,"\n");
    cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_298);
    std::__cxx11::string::string
              ((string *)&checkCache.field_0x1f8,(string *)cacheFile.field_2._8_8_);
    pcVar5 = cmake::GetCMakeFilesDirectory();
    std::__cxx11::string::operator+=((string *)&checkCache.field_0x1f8,pcVar5);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmsys::SystemTools::MakeDirectory(pcVar5);
    std::__cxx11::string::operator+=((string *)&checkCache.field_0x1f8,"/cmake.check_cache");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_af0,pcVar5,_S_out);
    bVar2 = std::ios::operator!((ios *)(local_af0 + (long)*(_func_int **)((long)local_af0 + -0x18)))
    ;
    bVar3 = (bVar2 & 1) != 0;
    if (bVar3) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error
                ("Unable to open check cache file for write. ",pcVar5,(char *)0x0,(char *)0x0);
    }
    else {
      std::operator<<((ostream *)local_af0,
                      "# This file is generated by cmake for dependency checking of the CMakeCache.txt file\n"
                     );
    }
    this_local._7_1_ = !bVar3;
    std::ofstream::~ofstream(local_af0);
    std::__cxx11::string::~string((string *)&checkCache.field_0x1f8);
    std::__cxx11::string::~string((string *)local_740);
  }
  else {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error("Unable to open cache file for save. ",pcVar5,(char *)0x0,(char *)0x0);
    cmSystemTools::ReportLastSystemError("");
    this_local._7_1_ = false;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  std::__cxx11::string::~string(local_40);
  return this_local._7_1_;
}

Assistant:

bool cmCacheManager::SaveCache(const std::string& path)
{
  std::string cacheFile = path;
  cacheFile += "/CMakeCache.txt";
  cmGeneratedFileStream fout(cacheFile.c_str());
  fout.SetCopyIfDifferent(true);
  if(!fout)
    {
    cmSystemTools::Error("Unable to open cache file for save. ",
                         cacheFile.c_str());
    cmSystemTools::ReportLastSystemError("");
    return false;
    }
  // before writing the cache, update the version numbers
  // to the
  char temp[1024];
  sprintf(temp, "%d", cmVersion::GetMinorVersion());
  this->AddCacheEntry("CMAKE_CACHE_MINOR_VERSION", temp,
                      "Minor version of cmake used to create the "
                      "current loaded cache", cmState::INTERNAL);
  sprintf(temp, "%d", cmVersion::GetMajorVersion());
  this->AddCacheEntry("CMAKE_CACHE_MAJOR_VERSION", temp,
                      "Major version of cmake used to create the "
                      "current loaded cache", cmState::INTERNAL);
  sprintf(temp, "%d", cmVersion::GetPatchVersion());
  this->AddCacheEntry("CMAKE_CACHE_PATCH_VERSION", temp,
                      "Patch version of cmake used to create the "
                      "current loaded cache", cmState::INTERNAL);

  // Let us store the current working directory so that if somebody
  // Copies it, he will not be surprised
  std::string currentcwd = path;
  if ( currentcwd[0] >= 'A' && currentcwd[0] <= 'Z' &&
       currentcwd[1] == ':' )
    {
    // Cast added to avoid compiler warning. Cast is ok because
    // value is guaranteed to fit in char by the above if...
    currentcwd[0] = static_cast<char>(currentcwd[0] - 'A' + 'a');
    }
  cmSystemTools::ConvertToUnixSlashes(currentcwd);
  this->AddCacheEntry("CMAKE_CACHEFILE_DIR", currentcwd.c_str(),
                      "This is the directory where this CMakeCache.txt"
                      " was created", cmState::INTERNAL);

  fout << "# This is the CMakeCache file.\n"
       << "# For build in directory: " << currentcwd << "\n"
       << "# It was generated by CMake: "
       << cmSystemTools::GetCMakeCommand() << std::endl;

  fout << "# You can edit this file to change values found and used by cmake."
       << std::endl
       << "# If you do not want to change any of the values, simply exit the "
       "editor." << std::endl
       << "# If you do want to change a value, simply edit, save, and exit "
       "the editor." << std::endl
       << "# The syntax for the file is as follows:\n"
       << "# KEY:TYPE=VALUE\n"
       << "# KEY is the name of a variable in the cache.\n"
       << "# TYPE is a hint to GUIs for the type of VALUE, DO NOT EDIT "
       "TYPE!." << std::endl
       << "# VALUE is the current value for the KEY.\n\n";

  fout << "########################\n";
  fout << "# EXTERNAL cache entries\n";
  fout << "########################\n";
  fout << "\n";

  for( std::map<std::string, CacheEntry>::const_iterator i =
         this->Cache.begin(); i != this->Cache.end(); ++i)
    {
    const CacheEntry& ce = (*i).second;
    cmState::CacheEntryType t = ce.Type;
    if(!ce.Initialized)
      {
      /*
        // This should be added in, but is not for now.
      cmSystemTools::Error("Cache entry \"", (*i).first.c_str(),
                           "\" is uninitialized");
      */
      }
    else if(t != cmState::INTERNAL)
      {
      // Format is key:type=value
      if(const char* help = ce.GetProperty("HELPSTRING"))
        {
        cmCacheManager::OutputHelpString(fout, help);
        }
      else
        {
        cmCacheManager::OutputHelpString(fout, "Missing description");
        }
      this->OutputKey(fout, i->first);
      fout << ":" << cmState::CacheEntryTypeToString(t) << "=";
      this->OutputValue(fout, ce.Value);
      fout << "\n\n";
      }
    }

  fout << "\n";
  fout << "########################\n";
  fout << "# INTERNAL cache entries\n";
  fout << "########################\n";
  fout << "\n";

  for( cmCacheManager::CacheIterator i = this->NewIterator();
       !i.IsAtEnd(); i.Next())
    {
    if ( !i.Initialized() )
      {
      continue;
      }

    cmState::CacheEntryType t = i.GetType();
    this->WritePropertyEntries(fout, i);
    if(t == cmState::INTERNAL)
      {
      // Format is key:type=value
      if(const char* help = i.GetProperty("HELPSTRING"))
        {
        this->OutputHelpString(fout, help);
        }
      this->OutputKey(fout, i.GetName());
      fout << ":" << cmState::CacheEntryTypeToString(t) << "=";
      this->OutputValue(fout, i.GetValue());
      fout << "\n";
      }
    }
  fout << "\n";
  fout.Close();
  std::string checkCacheFile = path;
  checkCacheFile += cmake::GetCMakeFilesDirectory();
  cmSystemTools::MakeDirectory(checkCacheFile.c_str());
  checkCacheFile += "/cmake.check_cache";
  cmsys::ofstream checkCache(checkCacheFile.c_str());
  if(!checkCache)
    {
    cmSystemTools::Error("Unable to open check cache file for write. ",
                         checkCacheFile.c_str());
    return false;
    }
  checkCache << "# This file is generated by cmake for dependency checking "
    "of the CMakeCache.txt file\n";
  return true;
}